

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::MultiThreadedTest::iterate(MultiThreadedTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  pointer pMVar3;
  TestContext *this_00;
  ulong uVar4;
  bool bVar5;
  TestThread *this_01;
  deUint64 dVar6;
  pointer ppTVar7;
  pointer ppTVar8;
  uint uVar9;
  int iVar10;
  char *description;
  qpTestResult testResult;
  size_type __new_size;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  long lVar16;
  vector<int,_std::allocator<int>_> messageNdx;
  vector<int,_std::allocator<int>_> local_1e8;
  ulong local_1c8;
  ulong local_1c0;
  deUint64 local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  if (this->m_initialized == true) {
    ppTVar7 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppTVar8 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Thread timeout limit: ",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"us",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::reserve
              (&this->m_threads,(long)this->m_threadCount);
    if (0 < this->m_threadCount) {
      iVar10 = 0;
      do {
        this_01 = (TestThread *)operator_new(0x1b8);
        TestThread::TestThread(this_01,this,iVar10);
        local_1b0._0_8_ = this_01;
        std::vector<deqp::egl::TestThread*,std::allocator<deqp::egl::TestThread*>>::
        emplace_back<deqp::egl::TestThread*>
                  ((vector<deqp::egl::TestThread*,std::allocator<deqp::egl::TestThread*>> *)
                   &this->m_threads,(TestThread **)local_1b0);
        iVar10 = iVar10 + 1;
      } while (iVar10 < this->m_threadCount);
    }
    dVar6 = deGetMicroseconds();
    this->m_startTimeUs = dVar6;
    ppTVar7 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppTVar8 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)ppTVar8 - (long)ppTVar7) >> 3)) {
      lVar16 = 0;
      do {
        de::Thread::start(&ppTVar7[lVar16]->super_Thread);
        lVar16 = lVar16 + 1;
        ppTVar7 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppTVar8 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (lVar16 < (int)((ulong)((long)ppTVar8 - (long)ppTVar7) >> 3));
    }
    this->m_initialized = true;
  }
  uVar9 = (uint)((ulong)((long)ppTVar8 - (long)ppTVar7) >> 3);
  if ((int)uVar9 < 1) {
    iVar10 = 0;
  }
  else {
    uVar12 = 0;
    iVar10 = 0;
    do {
      iVar10 = iVar10 + (uint)(ppTVar7[uVar12]->m_status != THREADSTATUS_RUNNING);
      uVar12 = uVar12 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar12);
  }
  if (iVar10 != this->m_threadCount) {
    local_1b8 = deGetMicroseconds();
    local_1c8 = local_1b8 - this->m_startTimeUs;
    uVar12 = this->m_timeoutUs;
    if (uVar12 < local_1c8) {
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
      local_1c0 = uVar12;
      std::vector<int,_std::allocator<int>_>::resize
                (&local_1e8,
                 (long)(this->m_threads).
                       super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_threads).
                       super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (value_type_conflict1 *)local_1b0);
      ppTVar8 = (this->m_threads).
                super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (ulong)((long)(this->m_threads).
                             super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8) >> 3;
      if (0 < (int)uVar12) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        do {
          iVar10 = -1;
          uVar11 = 0;
          uVar13 = 0;
          do {
            iVar2 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11];
            lVar16 = *(long *)&(ppTVar8[uVar11]->m_log).m_messages.
                               super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                               ._M_impl.super__Vector_impl_data;
            iVar14 = (int)((ulong)((long)(ppTVar8[uVar11]->m_log).m_messages.
                                         super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - lVar16) >> 3);
            if ((SBORROW4(iVar2,iVar14 * -0x33333333) != iVar2 + iVar14 * 0x33333333 < 0) &&
               (uVar4 = *(ulong *)(lVar16 + (long)iVar2 * 0x28), uVar4 < uVar13 || iVar10 == -1)) {
              iVar10 = (int)uVar11;
              uVar13 = uVar4;
            }
            uVar11 = uVar11 + 1;
          } while (((uint)uVar12 & 0x7fffffff) != uVar11);
          if (iVar10 == -1) break;
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] (",3);
          std::ostream::operator<<(poVar1,iVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
          lVar16 = *(long *)&((this->m_threads).
                              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar10]->m_log).m_messages.
                             super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                             ._M_impl.super__Vector_impl_data;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     *(char **)(lVar16 + 8 +
                               (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start[iVar10] * 0x28),
                     *(long *)(lVar16 + 0x10 +
                              (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[iVar10] * 0x28));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar10] =
               local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar10] + 1;
          ppTVar8 = (this->m_threads).
                    super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar12 = (ulong)((long)(this->m_threads).
                                 super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8) >> 3;
        } while (0 < (int)uVar12);
      }
      if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      uVar12 = local_1c0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"] (-) Timeout, Limit: ",0x16);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"us",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"] (-) Trying to perform resource cleanup...",0x2b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      deSleep(10);
    }
    return (uint)(local_1c8 <= uVar12);
  }
  __new_size = (long)ppTVar8 - (long)ppTVar7 >> 3;
  bVar5 = true;
  if (0 < (int)__new_size) {
    lVar16 = 0;
    do {
      de::Thread::join(&ppTVar7[lVar16]->super_Thread);
      lVar16 = lVar16 + 1;
      ppTVar7 = (this->m_threads).
                super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (long)(this->m_threads).
                     super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7;
    } while (lVar16 < (int)(uVar12 >> 3));
    __new_size = (long)uVar12 >> 3;
    if (0 < (int)(uint)__new_size) {
      bVar5 = true;
      uVar12 = 0;
      bVar15 = false;
      do {
        bVar5 = (bool)(bVar5 & ppTVar7[uVar12]->m_status != THREADSTATUS_ERROR);
        bVar15 = (bool)(bVar15 | ppTVar7[uVar12]->m_status == THREADSTATUS_NOT_SUPPORTED);
        uVar12 = uVar12 + 1;
      } while (((uint)__new_size & 0x7fffffff) != uVar12);
      goto LAB_00e1b1c8;
    }
  }
  bVar15 = false;
LAB_00e1b1c8:
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_1e8,__new_size,(value_type_conflict1 *)local_1b0);
  ppTVar8 = (this->m_threads).
            super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar7 = (this->m_threads).
            super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar12 = (ulong)((long)ppTVar7 - (long)ppTVar8) >> 3;
  uVar9 = (uint)uVar12;
  if (0 < (int)uVar9) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    do {
      uVar9 = (uint)uVar12;
      iVar10 = -1;
      uVar13 = 0;
      uVar12 = 0;
      do {
        iVar2 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13];
        pMVar3 = (ppTVar8[uVar13]->m_log).m_messages.
                 super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar14 = (int)((ulong)((long)(ppTVar8[uVar13]->m_log).m_messages.
                                     super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3) >> 3
                      );
        if ((SBORROW4(iVar2,iVar14 * -0x33333333) != iVar2 + iVar14 * 0x33333333 < 0) &&
           (uVar11 = pMVar3[iVar2].timeUs, uVar11 < uVar12 || iVar10 == -1)) {
          iVar10 = (int)uVar13;
          uVar12 = uVar11;
        }
        uVar13 = uVar13 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar13);
      if (iVar10 == -1) break;
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] (",3);
      std::ostream::operator<<(poVar1,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
      lVar16 = *(long *)&((this->m_threads).
                          super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar10]->m_log).m_messages.
                         super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                         ._M_impl.super__Vector_impl_data;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 *(char **)(lVar16 + 8 +
                           (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar10] * 0x28),
                 *(long *)(lVar16 + 0x10 +
                          (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar10] * 0x28));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar10] =
           local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar10] + 1;
      ppTVar8 = (this->m_threads).
                super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar7 = (this->m_threads).
                super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar12 = (ulong)((long)ppTVar7 - (long)ppTVar8) >> 3;
      uVar9 = (uint)uVar12;
    } while (0 < (int)uVar9);
  }
  if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    ppTVar8 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppTVar7 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = (uint)((ulong)((long)ppTVar7 - (long)ppTVar8) >> 3);
  }
  if (0 < (int)uVar9) {
    lVar16 = 0;
    do {
      if (ppTVar8[lVar16] != (TestThread *)0x0) {
        (*(ppTVar8[lVar16]->super_Thread)._vptr_Thread[1])();
        ppTVar8 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppTVar7 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)((ulong)((long)ppTVar7 - (long)ppTVar8) >> 3));
  }
  if (ppTVar7 != ppTVar8) {
    (this->m_threads).
    super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar8;
  }
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  if (bVar5) {
    if (!bVar15) {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  else {
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

TestCase::IterateResult MultiThreadedTest::iterate (void)
{
	if (!m_initialized)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Thread timeout limit: " << m_timeoutUs << "us" << tcu::TestLog::EndMessage;

		// Create threads
		m_threads.reserve(m_threadCount);

		for (int threadNdx = 0; threadNdx < m_threadCount; threadNdx++)
			m_threads.push_back(new TestThread(*this, threadNdx));

		m_startTimeUs = deGetMicroseconds();

		// Run threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->start();

		m_initialized = true;
	}

	int readyCount = 0;
	for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
	{
		if (m_threads[threadNdx]->getStatus() != TestThread::THREADSTATUS_RUNNING)
			readyCount++;
	}

	if (readyCount == m_threadCount)
	{
		// Join threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->join();

		bool isOk			= true;
		bool notSupported	= false;

		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			if (m_threads[threadNdx]->getStatus() == TestThread::THREADSTATUS_ERROR)
				isOk = false;

			if (m_threads[threadNdx]->getStatus() == TestThread::THREADSTATUS_NOT_SUPPORTED)
				notSupported = true;
		}

		// Get logs
		{
			vector<int> messageNdx;

			messageNdx.resize(m_threads.size(), 0);

			while (true)
			{
				int			nextThreadNdx		= -1;
				deUint64	nextThreadTimeUs	= 0;

				for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
				{
					if (messageNdx[threadNdx] >= (int)m_threads[threadNdx]->getLog().getMessages().size())
						continue;

					if (nextThreadNdx == -1 || nextThreadTimeUs > m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs)
					{
						nextThreadNdx		= threadNdx;
						nextThreadTimeUs	= m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs;
					}
				}

				if (nextThreadNdx == -1)
					break;

				m_testCtx.getLog() << tcu::TestLog::Message << "[" << (nextThreadTimeUs - m_startTimeUs) << "] (" << nextThreadNdx << ") " << m_threads[nextThreadNdx]->getLog().getMessages()[messageNdx[nextThreadNdx]].msg << tcu::TestLog::EndMessage;

				messageNdx[nextThreadNdx]++;
			}
		}

		// Destroy threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			delete m_threads[threadNdx];

		m_threads.clear();

		// Set result
		if (isOk)
		{
			if (notSupported)
				m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}
	else
	{
		// Check for timeout
		const deUint64 currentTimeUs = deGetMicroseconds();

		if (currentTimeUs - m_startTimeUs > m_timeoutUs)
		{
			// Get logs
			{
				vector<int> messageNdx;

				messageNdx.resize(m_threads.size(), 0);

				while (true)
				{
					int			nextThreadNdx		= -1;
					deUint64	nextThreadTimeUs	= 0;

					for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
					{
						if (messageNdx[threadNdx] >= (int)m_threads[threadNdx]->getLog().getMessages().size())
							continue;

						if (nextThreadNdx == -1 || nextThreadTimeUs > m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs)
						{
							nextThreadNdx		= threadNdx;
							nextThreadTimeUs	= m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs;
						}
					}

					if (nextThreadNdx == -1)
						break;

					m_testCtx.getLog() << tcu::TestLog::Message << "[" << (nextThreadTimeUs - m_startTimeUs) << "] (" << nextThreadNdx << ") " << m_threads[nextThreadNdx]->getLog().getMessages()[messageNdx[nextThreadNdx]].msg << tcu::TestLog::EndMessage;

					messageNdx[nextThreadNdx]++;
				}
			}

			m_testCtx.getLog() << tcu::TestLog::Message << "[" << (currentTimeUs - m_startTimeUs) << "] (-) Timeout, Limit: " << m_timeoutUs << "us" << tcu::TestLog::EndMessage;
			m_testCtx.getLog() << tcu::TestLog::Message << "[" << (currentTimeUs - m_startTimeUs) << "] (-) Trying to perform resource cleanup..." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		// Sleep
		deSleep(10);
	}

	return CONTINUE;
}